

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::File,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  size_t sVar1;
  Iface *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *pFVar7;
  long in_RSI;
  char *pcVar8;
  DiskHandle *this_00;
  StringPtr name;
  Own<const_kj::File,_std::nullptr_t> OVar9;
  int newFd_;
  Fault f;
  String temp;
  int local_84;
  OwnFd local_80;
  OwnFd local_7c;
  Path local_78;
  String local_58;
  Function<int_(kj::StringPtr)> local_40;
  Fault local_30;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar5 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    iVar4 = (int)lVar5;
    local_84 = iVar4;
    if (-1 < iVar4) goto LAB_0046fdcb;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (1 < iVar3 - 0x15U) {
    if (iVar3 == 0) {
LAB_0046fdcb:
      local_58.content.ptr = (char *)CONCAT44(local_58.content.ptr._4_4_,0xffffffff);
      local_78.parts.ptr._0_4_ = iVar4;
      puVar6 = (undefined8 *)operator_new(0x10);
      *(int *)(puVar6 + 1) = iVar4;
      local_78.parts.ptr._0_4_ = 0xffffffff;
      *puVar6 = &PTR_getFd_00627468;
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
      *(undefined8 **)&this->super_DiskHandle = puVar6;
      OwnFd::~OwnFd((OwnFd *)&local_78);
      OwnFd::~OwnFd((OwnFd *)&local_58);
      pFVar7 = extraout_RDX;
      goto LAB_00470029;
    }
    if (iVar3 != 0x5f) {
      local_78.parts.ptr._0_4_ = 0;
      local_78.parts.ptr._4_4_ = 0;
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_78,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault((Fault *)&local_78);
    }
  }
  name.content.size_ = 8;
  name.content.ptr = "unnamed";
  Path::Path(&local_78,name);
  finalName.parts.ptr._4_4_ = local_78.parts.ptr._4_4_;
  finalName.parts.ptr._0_4_ = (int)local_78.parts.ptr;
  finalName.parts.size_ = local_78.parts.size_;
  local_40.impl.ptr = (Iface *)operator_new(0x18);
  (local_40.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006278f8;
  local_40.impl.ptr[1]._vptr_Iface = (_func_int **)&local_84;
  local_40.impl.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_40.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary(&local_58,this_00,finalName,CREATE,&local_40);
  pIVar2 = local_40.impl.ptr;
  if (local_40.impl.ptr != (Iface *)0x0) {
    local_40.impl.ptr = (Iface *)0x0;
    (**(local_40.impl.disposer)->_vptr_Disposer)
              (local_40.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  sVar1 = local_78.parts.size_;
  lVar5 = CONCAT44(local_78.parts.ptr._4_4_,(int)local_78.parts.ptr);
  if (lVar5 != 0) {
    local_78.parts.ptr._0_4_ = 0;
    local_78.parts.ptr._4_4_ = 0;
    local_78.parts.size_ = 0;
    (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
              (local_78.parts.disposer,lVar5,0x18,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  iVar4 = local_84;
  local_80.fd = local_84;
  local_7c.fd = -1;
  puVar6 = (undefined8 *)operator_new(0x10);
  *(int *)(puVar6 + 1) = iVar4;
  local_80.fd = -1;
  *puVar6 = &PTR_getFd_00627468;
  OwnFd::~OwnFd(&local_80);
  do {
    pcVar8 = "";
    if (local_58.content.size_ != 0) {
      pcVar8 = local_58.content.ptr;
    }
    iVar4 = unlinkat((this_00->fd).fd,pcVar8,0);
    if (-1 < iVar4) goto LAB_0046ffe5;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_30.exception = (Exception *)0x0;
    local_78.parts.ptr._0_4_ = 0;
    local_78.parts.ptr._4_4_ = 0;
    local_78.parts.size_ = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_30);
  }
LAB_0046ffe5:
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
  *(undefined8 **)&this->super_DiskHandle = puVar6;
  OwnFd::~OwnFd(&local_7c);
  sVar1 = local_58.content.size_;
  pcVar8 = local_58.content.ptr;
  pFVar7 = extraout_RDX_00;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar8,1,sVar1,sVar1,0);
    pFVar7 = extraout_RDX_01;
  }
LAB_00470029:
  OVar9.ptr = pFVar7;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }